

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updatePF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  int iVar1;
  reference pvVar2;
  int in_ECX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined4 *in_R8;
  double value;
  int index;
  int i;
  double *columnArray;
  int *columnIndex;
  int columnCount;
  value_type *in_stack_ffffffffffffff88;
  pointer *this_00;
  value_type_conflict1 *in_stack_ffffffffffffff98;
  int local_44;
  
  iVar1 = *(int *)(in_RSI + 0x84);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x88),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xa0),0);
  for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
    if (pvVar2[local_44] != in_ECX) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_RDI,(value_type *)in_stack_ffffffffffffff98
                );
      std::vector<double,_std::allocator<double>_>::push_back(in_RDI,in_stack_ffffffffffffff98);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_RDI,(value_type *)in_stack_ffffffffffffff98);
  this_00 = &in_RDI[0x32].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)in_ECX);
  std::vector<double,_std::allocator<double>_>::push_back(in_RDI,in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)
             &in_RDI[0x35].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffff88);
  *(int *)((long)&in_RDI[0x29].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 4) =
       *(int *)(in_RSI + 0x84) +
       *(int *)((long)&in_RDI[0x29].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4);
  if (*(int *)&in_RDI[0x29].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish <
      *(int *)((long)&in_RDI[0x29].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4)) {
    *in_R8 = 1;
  }
  *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish =
       *(int *)(in_RSI + 0x84) +
       *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  return;
}

Assistant:

void HFactor::updatePF(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Check space
    const int columnCount = aq->packCount;
    const int *columnIndex = &aq->packIndex[0];
    const double *columnArray = &aq->packValue[0];

    // Copy the pivotal column
    for (int i = 0; i < columnCount; i++) {
        int index = columnIndex[i];
        double value = columnArray[i];
        if (index != iRow) {
            PFindex.push_back(index);
            PFvalue.push_back(value);
        }
    }

    // Save pivot
    PFpivotIndex.push_back(iRow);
    PFpivotValue.push_back(aq->array[iRow]);
    PFstart.push_back(PFindex.size());

    // Check refactor
    UtotalX += aq->packCount;
    if (UtotalX > UmeritX)
        *hint = 1;
    FtotalX += aq->packCount;
}